

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool enchant_spell(wchar_t num_hit,wchar_t num_dam,wchar_t num_ac,command *cmd)

{
  _Bool _Var1;
  _Bool _Var2;
  wchar_t wVar3;
  char *pcVar4;
  char *pcVar5;
  code *tester;
  object *obj;
  char o_name [80];
  object *local_80;
  char local_78 [80];
  
  if (num_ac == L'\0') {
    tester = tval_is_weapon;
  }
  else {
    tester = tval_is_armor;
  }
  if (cmd == (command *)0x0) {
    _Var1 = get_item(&local_80,"Enchant which item? ","You have nothing to enchant.",CMD_NULL,tester
                     ,L'\x0f');
    if (!_Var1) {
      return false;
    }
  }
  else {
    wVar3 = cmd_get_item((command_conflict *)cmd,"tgtitem",&local_80,"Enchant which item? ",
                         "You have nothing to enchant.",tester,L'\x0f');
    if (wVar3 != L'\0') {
      return false;
    }
  }
  object_desc(local_78,0x50,local_80,0,player);
  _Var1 = object_is_carried(player,local_80);
  pcVar5 = "The";
  if (_Var1) {
    pcVar5 = "Your";
  }
  pcVar4 = "s";
  if (1 < local_80->number) {
    pcVar4 = "";
  }
  msg("%s %s glow%s brightly!",pcVar5,local_78,pcVar4);
  if (num_dam != L'\0') {
    _Var1 = enchant(local_80,num_hit,L'\x03');
    _Var2 = true;
    if (_Var1) goto LAB_0013d008;
  }
  _Var1 = enchant(local_80,num_hit,L'\x01');
  _Var2 = true;
  if (!_Var1) {
    _Var2 = enchant(local_80,num_dam,L'\x02');
  }
LAB_0013d008:
  _Var1 = enchant(local_80,num_ac,L'\x04');
  if ((!_Var1) && (_Var2 == false)) {
    event_signal(EVENT_INPUT_FLUSH);
    msg("The enchantment failed.");
  }
  return true;
}

Assistant:

static bool enchant_spell(int num_hit, int num_dam, int num_ac, struct command *cmd)
{
	bool okay = false;

	struct object *obj;

	char o_name[80];

	const char *q, *s;
	int itemmode = (USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR);
	item_tester filter = num_ac ? tval_is_armor : tval_is_weapon;

	/* Get an item */
	q = "Enchant which item? ";
	s = "You have nothing to enchant.";
	if (cmd) {
		if (cmd_get_item(cmd, "tgtitem", &obj, q, s, filter,
				itemmode)) {
			return false;
		}
	} else if (!get_item(&obj, q, s, 0, filter, itemmode))
		return false;

	/* Description */
	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, player);

	/* Describe */
	msg("%s %s glow%s brightly!",
		(object_is_carried(player, obj) ? "Your" : "The"), o_name,
			   ((obj->number > 1) ? "" : "s"));

	/* Enchant */
	if (num_dam && enchant(obj, num_hit, ENCH_TOBOTH)) okay = true;
	else if (enchant(obj, num_hit, ENCH_TOHIT)) okay = true;
	else if (enchant(obj, num_dam, ENCH_TODAM)) okay = true;
	if (enchant(obj, num_ac, ENCH_TOAC)) okay = true;

	/* Failure */
	if (!okay) {
		event_signal(EVENT_INPUT_FLUSH);

		/* Message */
		msg("The enchantment failed.");
	}

	/* Something happened */
	return (true);
}